

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSplineLoader.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::SplineLoader::SplineLoader
          (SplineLoader *this,IFilePartLoader *callingFilePartLoader,String *geometryId,
          String *geometryName)

{
  UniqueId *uniqueId;
  ulong uVar1;
  string *in_RCX;
  string *in_RDX;
  Spline *in_RDI;
  ClassId in_stack_000000dc;
  ParserChar *in_stack_000000e0;
  IFilePartLoader *in_stack_000000e8;
  String *in_stack_ffffffffffffff38;
  Geometry *in_stack_ffffffffffffff40;
  IFilePartLoader *in_stack_ffffffffffffff48;
  SourceArrayLoader *in_stack_ffffffffffffff50;
  Vertices *this_00;
  string local_70 [32];
  string local_50 [48];
  string *local_20;
  string *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  SourceArrayLoader::SourceArrayLoader(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  (in_RDI->super_Geometry).super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)359>.super_Object.
  _vptr_Object = (_func_int **)&PTR__SplineLoader_00dbfe80;
  std::__cxx11::string::c_str();
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)359>::ID();
  IFilePartLoader::createUniqueIdFromId(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc);
  this_00 = (Vertices *)&(in_RDI->mPositions).super_FloatOrDoubleArray.mValuesF.mCapacity;
  uniqueId = (UniqueId *)operator_new(0x220);
  COLLADAFW::Spline::Spline(in_RDI,uniqueId);
  this_00->_vptr_Vertices = (_func_int **)uniqueId;
  *(undefined8 *)&(in_RDI->mPositions).super_FloatOrDoubleArray.mValuesF.mFlags = 0;
  (in_RDI->mPositions).super_FloatOrDoubleArray.mValuesD.mData = (double *)0x0;
  (in_RDI->mPositions).super_FloatOrDoubleArray.mValuesD.mCount = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0xb37ef6);
  Vertices::Vertices(this_00);
  (in_RDI->mInTangents).super_FloatOrDoubleArray.mValuesF.mCapacity = 0;
  *(undefined1 *)&(in_RDI->mInTangents).super_FloatOrDoubleArray.mValuesF.mFlags = 0;
  *(undefined1 *)((long)&(in_RDI->mInTangents).super_FloatOrDoubleArray.mValuesF.mFlags + 1) = 1;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_50,local_20);
    COLLADAFW::Geometry::setName(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(local_50);
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      in_stack_ffffffffffffff40 =
           (Geometry *)(in_RDI->mPositions).super_FloatOrDoubleArray.mValuesF.mCapacity;
      std::__cxx11::string::string(local_70,local_18);
      COLLADAFW::Geometry::setName(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::__cxx11::string::~string(local_70);
    }
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    COLLADAFW::Geometry::setOriginalId(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

SplineLoader::SplineLoader( IFilePartLoader* callingFilePartLoader, const String& geometryId, const String& geometryName )
		: SourceArrayLoader (callingFilePartLoader )
		, mSplineUniqueId(createUniqueIdFromId((ParserChar*)geometryId.c_str(), COLLADAFW::Geometry::ID()))
		, mSpline ( new COLLADAFW::Spline(mSplineUniqueId) )
        , mInterpolations()
        , mVerticesInputs()
        , mCurrentVertexInput( 0 )
        , mInVertices ( false )
        , mInSpline (true)
	{
        if ( !geometryName.empty() )
            mSpline->setName ( geometryName );
        else if ( !geometryId.empty() )
            mSpline->setName ( geometryId );

        if ( !geometryId.empty() )
            mSpline->setOriginalId ( geometryId );
	}